

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O0

RC __thiscall RM_FileHandle::AllocateNewPage(RM_FileHandle *this,PF_PageHandle *ph,PageNum *page)

{
  RM_PageHeader *local_40;
  RM_PageHeader *pageheader;
  char *bitmap;
  PageNum *pPStack_28;
  RC rc;
  PageNum *page_local;
  PF_PageHandle *ph_local;
  RM_FileHandle *this_local;
  
  pPStack_28 = page;
  page_local = &ph->pageNum;
  ph_local = (PF_PageHandle *)this;
  bitmap._4_4_ = PF_FileHandle::AllocatePage(&this->pfh,ph);
  this_local._4_4_ = bitmap._4_4_;
  if (((bitmap._4_4_ == 0) &&
      (bitmap._4_4_ = PF_PageHandle::GetPageNum((PF_PageHandle *)page_local,pPStack_28),
      this_local._4_4_ = bitmap._4_4_, bitmap._4_4_ == 0)) &&
     (bitmap._4_4_ = GetPageDataAndBitmap
                               (this,(PF_PageHandle *)page_local,(char **)&pageheader,&local_40),
     this_local._4_4_ = bitmap._4_4_, bitmap._4_4_ == 0)) {
    local_40->nextFreePage = (this->header).firstFreePage;
    local_40->numRecords = 0;
    this_local._4_4_ = ResetBitmap(this,(char *)pageheader,(this->header).numRecordsPerPage);
    if (this_local._4_4_ == 0) {
      (this->header).numPages = (this->header).numPages + 1;
      (this->header).firstFreePage = *pPStack_28;
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

RC RM_FileHandle::AllocateNewPage(PF_PageHandle &ph, PageNum &page){
  RC rc;
  // allocate the page
  if((rc = pfh.AllocatePage(ph))){
    return (rc);
  }
  // get the page number of this allocated page
  if((rc = ph.GetPageNum(page)))
    return (rc);
 
  // create the page header
  char *bitmap;
  struct RM_PageHeader *pageheader;
  if((rc = GetPageDataAndBitmap(ph, bitmap, pageheader)))
    return (rc);
  pageheader->nextFreePage = header.firstFreePage;
  pageheader->numRecords = 0;
  if((rc = ResetBitmap(bitmap, header.numRecordsPerPage)))
    return (rc);

  header.numPages++; // update the file header to reflect addition of one
                     // more page
  // update the free pages linked list
  header.firstFreePage = page;
  return (0);
}